

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_drm.c
# Opt level: O2

MPP_RET os_allocator_drm_open(void **ctx,size_t alignment,MppAllocFlagType flags)

{
  uint uVar1;
  undefined4 *puVar2;
  long lVar3;
  MPP_RET MVar4;
  int iVar5;
  ulong unaff_R15;
  
  if (ctx == (void **)0x0) {
    _mpp_log_l(2,"mpp_drm","does not accept NULL input\n","os_allocator_drm_open");
    MVar4 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (void *)0x0;
    mpp_env_get_u32("drm_debug",&drm_debug,0);
    lVar3 = 0;
    do {
      if (lVar3 == 0x10) {
        iVar5 = (int)unaff_R15;
        unaff_R15 = 0;
        if (iVar5 < 0) {
          _mpp_log_l(2,"mpp_drm","open all drm device failed.\n","os_allocator_drm_open");
          _mpp_log_l(2,"mpp_drm","Please check the following device path and access permission:\n",
                     (char *)0x0);
          for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
            _mpp_log_l(2,"mpp_drm","%s\n",(char *)0x0,*(undefined8 *)((long)dev_drm + lVar3));
          }
          return MPP_ERR_UNKNOW;
        }
        break;
      }
      uVar1 = open64(*(char **)((long)dev_drm + lVar3),0x80002);
      unaff_R15 = (ulong)uVar1;
      lVar3 = lVar3 + 8;
    } while ((int)uVar1 < 1);
    iVar5 = (int)unaff_R15;
    drm_ioctl(iVar5,0x641f,(void *)0x0);
    if (((byte)drm_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_drm","open drm dev fd %d flags %x\n","os_allocator_drm_open",unaff_R15,
                 (ulong)flags);
    }
    puVar2 = (undefined4 *)mpp_osal_malloc("os_allocator_drm_open",0xc);
    if (puVar2 == (undefined4 *)0x0) {
      close(iVar5);
      _mpp_log_l(2,"mpp_drm","failed to allocate context\n","os_allocator_drm_open");
      MVar4 = MPP_ERR_MALLOC;
    }
    else {
      *puVar2 = (int)alignment;
      puVar2[2] = flags;
      puVar2[1] = iVar5;
      *ctx = puVar2;
      MVar4 = MPP_OK;
    }
  }
  return MVar4;
}

Assistant:

static MPP_RET os_allocator_drm_open(void **ctx, size_t alignment, MppAllocFlagType flags)
{
    allocator_ctx_drm *p;
    RK_S32 fd;
    RK_S32 i;

    if (NULL == ctx) {
        mpp_err_f("does not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;

    mpp_env_get_u32("drm_debug", &drm_debug, 0);

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dev_drm); i++) {
        fd = open(dev_drm[i], O_RDWR | O_CLOEXEC);
        if (fd > 0)
            break;
    }

    if (fd < 0) {
        mpp_err_f("open all drm device failed.\n");
        mpp_err("Please check the following device path and access permission:\n");
        for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dev_drm); i++)
            mpp_err("%s\n", dev_drm[i]);
        return MPP_ERR_UNKNOW;
    } else {
        /* drop master by default to avoid becoming the drm master */
        drm_ioctl(fd, DRM_IOCTL_DROP_MASTER, 0);
    }

    drm_dbg_dev("open drm dev fd %d flags %x\n", fd, flags);

    p = mpp_malloc(allocator_ctx_drm, 1);
    if (NULL == p) {
        close(fd);
        mpp_err_f("failed to allocate context\n");
        return MPP_ERR_MALLOC;
    } else {
        /*
         * default drm use cma, do nothing here
         */
        p->alignment    = alignment;
        p->flags        = flags;
        p->drm_device   = fd;
        *ctx = p;
    }

    return MPP_OK;
}